

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

Result __thiscall
testing::internal::FunctionMocker<ot::commissioner::State_()>::PerformDefaultAction
          (FunctionMocker<ot::commissioner::State_()> *this,ArgumentTuple *args,
          string *call_description)

{
  OnCallSpec<ot::commissioner::State_()> *this_00;
  long *plVar1;
  pointer pcVar2;
  char cVar3;
  Result RVar4;
  Result RVar5;
  Action<ot::commissioner::State_()> *pAVar6;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar7;
  string message;
  undefined **local_50;
  undefined8 local_48;
  undefined *local_40 [2];
  
  ppvVar7 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  while (ppvVar7 !=
         (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
         super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
         super__Vector_impl_data._M_start) {
    this_00 = (OnCallSpec<ot::commissioner::State_()> *)ppvVar7[-1];
    ppvVar7 = ppvVar7 + -1;
    local_48 = 0;
    local_50 = &PTR__MatchResultListener_002da950;
    plVar1 = *(long **)(this_00 + 0x20);
    cVar3 = (**(code **)(*plVar1 + 0x20))(plVar1,args,&local_50);
    if (cVar3 != '\0') {
      pAVar6 = OnCallSpec<ot::commissioner::State_()>::GetAction(this_00);
      RVar4 = Action<ot::commissioner::State_()>::Perform(pAVar6);
      return RVar4;
    }
  }
  pcVar2 = (call_description->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)&local_50);
  if (DefaultValue<ot::commissioner::State>::producer_ == (long *)0x0) {
    RVar5 = kDisabled;
  }
  else {
    RVar5 = (**(code **)(*DefaultValue<ot::commissioner::State>::producer_ + 0x10))();
  }
  if (local_50 == local_40) {
    return RVar5;
  }
  operator_delete(local_50);
  return RVar5;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }